

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float32_primitive_asRoundedInt64
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  float fVar2;
  sysbvm_object_tuple_t *floatObject;
  long value;
  sysbvm_tuple_t sVar3;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar2 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar2 = (float)(uVar1 >> 4);
  }
  value = (long)(fVar2 + 0.5);
  if (value + 0x800000000000000U >> 0x3c == 0) {
    return value << 4 | 0xc;
  }
  sVar3 = sysbvm_tuple_int64_encodeBig(context,value);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_asRoundedInt64(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_int64_encode(context, (int64_t)(sysbvm_tuple_float32_decode(arguments[0]) + 0.5f));
}